

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::correct_momentum_error
               (Mesh *mesh,TransferOpts *xfer_opts,Graph *diffusion_graph,TagBase *tagbase,
               bool verbose)

{
  VarCompareOpts opts;
  uint ent_dim;
  Int ncomps_00;
  LO n;
  string *psVar1;
  pointer ppVar2;
  pointer ppVar3;
  Int ent_dim_00;
  Read<double> local_670;
  Read<double> local_660;
  undefined1 local_650 [40];
  Reals new_velocities;
  type f;
  string local_568 [32];
  Read<double> local_548;
  undefined1 local_538 [8];
  Write<double> out;
  Read<double> local_500;
  Read<double> local_4f0;
  Graph local_4e0;
  undefined1 local_4c0 [32];
  VarCompareOpts diffuse_tol;
  allocator local_481;
  string local_480 [32];
  Read<double> local_460;
  Read<double> local_450;
  Read<double> local_440;
  undefined1 local_430 [8];
  Read<double> elem_errors;
  Read<signed_char> all_flags;
  Adj elems2verts;
  Read<double> local_3d0;
  Read<double> local_3c0;
  Graph local_3b0;
  undefined1 local_390 [8];
  Read<double> vert_masses;
  Adj verts2elems;
  Read<double> local_340;
  undefined1 local_330 [8];
  Read<double> elem_errors_from_density;
  string local_318 [32];
  Read<double> local_2f8;
  Read<double> local_2e8;
  Write<double> local_2d8;
  undefined1 local_2c8 [8];
  Reals new_elem_momenta;
  string local_2b0 [32];
  Read<double> local_290;
  Read<double> local_280;
  Write<double> local_270;
  undefined1 local_260 [8];
  Reals old_elem_momenta;
  undefined1 local_240 [8];
  Reals elem_velocities;
  string local_228 [32];
  Read<double> local_208;
  Read<double> local_1f8;
  Write<double> local_1e8;
  undefined1 local_1d8 [8];
  Reals old_elem_masses;
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  undefined1 local_180 [8];
  Read<double> old_elem_densities;
  Read<double> vert_velocities;
  string local_158 [32];
  Read<double> local_138;
  Read<double> local_128;
  Write<double> local_118;
  undefined1 local_108 [8];
  Reals elem_masses;
  Reals elem_sizes;
  Read<double> elem_densities;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> density_name;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> momentum_name;
  string local_58 [8];
  string velocity_name;
  Int ncomps;
  Int dim;
  bool verbose_local;
  TagBase *tagbase_local;
  Graph *diffusion_graph_local;
  TransferOpts *xfer_opts_local;
  Mesh *mesh_local;
  
  ent_dim = Mesh::dim(mesh);
  ncomps_00 = TagBase::ncomps(tagbase);
  psVar1 = TagBase::name_abi_cxx11_(tagbase);
  std::__cxx11::string::string(local_58,(string *)psVar1);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&xfer_opts->velocity_momentum_map,(key_type *)local_58);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_80);
  std::__cxx11::string::string(local_78,(string *)&ppVar2->second);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&xfer_opts->velocity_density_map,(key_type *)local_58);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_b8);
  std::__cxx11::string::string(local_b0,(string *)&ppVar2->second);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &elem_densities.write_.shared_alloc_.direct_ptr,(char *)local_78);
  ent_dim_00 = (Int)mesh;
  Mesh::get_array<double>
            ((Mesh *)&elem_sizes.write_.shared_alloc_.direct_ptr,ent_dim_00,(string *)(ulong)ent_dim
            );
  Mesh::ask_sizes((Mesh *)&elem_masses.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_128,(Read<double> *)&elem_sizes.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_138,(Read<double> *)&elem_masses.write_.shared_alloc_.direct_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,"",(allocator *)((long)&vert_velocities.write_.shared_alloc_.direct_ptr + 7))
  ;
  multiply_each<double>((Omega_h *)&local_118,&local_128,&local_138,(string *)local_158);
  Read<double>::Read((Read<double> *)local_108,&local_118);
  Write<double>::~Write(&local_118);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&vert_velocities.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::~Read(&local_138);
  Read<double>::~Read(&local_128);
  Mesh::get_array<double>
            ((Mesh *)&old_elem_densities.write_.shared_alloc_.direct_ptr,ent_dim_00,(string *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,"old_",
             (allocator *)((long)&old_elem_masses.write_.shared_alloc_.direct_ptr + 7));
  std::operator+(local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
  Mesh::get_array<double>((Mesh *)local_180,ent_dim_00,(string *)(ulong)ent_dim);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&old_elem_masses.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::Read(&local_1f8,(Read<double> *)local_180);
  Read<double>::Read(&local_208,(Read<double> *)&elem_masses.write_.shared_alloc_.direct_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_228,"",(allocator *)((long)&elem_velocities.write_.shared_alloc_.direct_ptr + 7))
  ;
  multiply_each<double>((Omega_h *)&local_1e8,&local_1f8,&local_208,(string *)local_228);
  Read<double>::Read((Read<double> *)local_1d8,&local_1e8);
  Write<double>::~Write(&local_1e8);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&elem_velocities.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::~Read(&local_208);
  Read<double>::~Read(&local_1f8);
  Read<double>::Read((Read<double> *)&old_elem_momenta.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&old_elem_densities.write_.shared_alloc_.direct_ptr);
  average_field((Omega_h *)local_240,mesh,ent_dim,ncomps_00,
                (Reals *)&old_elem_momenta.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&old_elem_momenta.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_280,(Read<double> *)local_240);
  Read<double>::Read(&local_290,(Read<double> *)local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2b0,"",(allocator *)((long)&new_elem_momenta.write_.shared_alloc_.direct_ptr + 7)
            );
  multiply_each<double>((Omega_h *)&local_270,&local_280,&local_290,(string *)local_2b0);
  Read<double>::Read((Read<double> *)local_260,&local_270);
  Write<double>::~Write(&local_270);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&new_elem_momenta.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::~Read(&local_290);
  Read<double>::~Read(&local_280);
  Read<double>::Read(&local_2e8,(Read<double> *)local_240);
  Read<double>::Read(&local_2f8,(Read<double> *)local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_318,"",
             (allocator *)((long)&elem_errors_from_density.write_.shared_alloc_.direct_ptr + 7));
  multiply_each<double>((Omega_h *)&local_2d8,&local_2e8,&local_2f8,(string *)local_318);
  Read<double>::Read((Read<double> *)local_2c8,&local_2d8);
  Write<double>::~Write(&local_2d8);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&elem_errors_from_density.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::~Read(&local_2f8);
  Read<double>::~Read(&local_2e8);
  Read<double>::Read(&local_340,(Read<double> *)local_2c8);
  Read<double>::Read((Read<double> *)&verts2elems.codes.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_260);
  subtract_each<double>
            ((Omega_h *)local_330,&local_340,
             (Read<double> *)&verts2elems.codes.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&verts2elems.codes.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_340);
  Mesh::ask_up((Adj *)&vert_masses.write_.shared_alloc_.direct_ptr,mesh,0,ent_dim);
  Graph::Graph(&local_3b0,(Graph *)&vert_masses.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_3c0,(Read<double> *)local_108);
  graph_reduce<double>((Omega_h *)local_390,&local_3b0,&local_3c0,1,OMEGA_H_SUM);
  Read<double>::~Read(&local_3c0);
  Graph::~Graph(&local_3b0);
  Read<double>::Read((Read<double> *)&elems2verts.codes.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_390);
  divide_each_by<double>
            ((Omega_h *)&local_3d0,
             (Read<double> *)&elems2verts.codes.write_.shared_alloc_.direct_ptr,
             (double)(int)(ent_dim + 1));
  Read<double>::operator=((Read<double> *)local_390,&local_3d0);
  Read<double>::~Read(&local_3d0);
  Read<double>::~Read((Read<double> *)&elems2verts.codes.write_.shared_alloc_.direct_ptr);
  Mesh::ask_down((Adj *)&all_flags.write_.shared_alloc_.direct_ptr,mesh,ent_dim,0);
  get_comps_are_fixed((Omega_h *)&elem_errors.write_.shared_alloc_.direct_ptr,mesh);
  Mesh::get_array<double>((Mesh *)local_430,ent_dim_00,(string *)(ulong)ent_dim);
  Read<double>::Read(&local_450,(Read<double> *)local_430);
  Read<double>::Read(&local_460,(Read<double> *)local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"",&local_481);
  add_each<double>((Omega_h *)&local_440,&local_450,&local_460,(string *)local_480);
  Read<double>::operator=((Read<double> *)local_430,&local_440);
  Read<double>::~Read(&local_440);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  Read<double>::~Read(&local_460);
  Read<double>::~Read(&local_450);
  local_4c0._16_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
       ::find(&xfer_opts->integral_diffuse_map,(key_type *)local_78);
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>
                         *)(local_4c0 + 0x10));
  diffuse_tol.tolerance = (ppVar3->second).floor;
  local_4c0._24_8_ = *(undefined8 *)&ppVar3->second;
  diffuse_tol._0_8_ = (ppVar3->second).tolerance;
  Graph::Graph(&local_4e0,diffusion_graph);
  Read<double>::Read(&local_4f0,(Read<double> *)local_430);
  Read<double>::Read(&local_500,(Read<double> *)local_2c8);
  opts.tolerance = (Real)diffuse_tol._0_8_;
  opts._0_8_ = local_4c0._24_8_;
  opts.floor = diffuse_tol.tolerance;
  diffuse_integrals_weighted
            ((Mesh *)local_4c0,(Graph *)mesh,(Reals *)&local_4e0,&local_4f0,opts,
             (string *)&local_500,(bool)((char)&elem_densities + '\b'));
  Read<double>::operator=((Read<double> *)local_430,(Read<double> *)local_4c0);
  Read<double>::~Read((Read<double> *)local_4c0);
  Read<double>::~Read(&local_500);
  Read<double>::~Read(&local_4f0);
  Graph::~Graph(&local_4e0);
  Read<double>::Read((Read<double> *)&out.shared_alloc_.direct_ptr,(Read<double> *)local_430);
  Mesh::set_tag<double>
            (mesh,ent_dim,(string *)&elem_densities.write_.shared_alloc_.direct_ptr,
             (Read<double> *)&out.shared_alloc_.direct_ptr,false);
  Read<double>::~Read((Read<double> *)&out.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_548,(Read<double> *)&old_elem_densities.write_.shared_alloc_.direct_ptr)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_568,"",(allocator *)((long)&f.elem_errors.write_.shared_alloc_.direct_ptr + 7));
  deep_copy<double>((Omega_h *)local_538,(Read<signed_char> *)&local_548,(string *)local_568);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.elem_errors.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::~Read(&local_548);
  Read<signed_char>::Read
            ((Read<signed_char> *)&new_velocities.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&elem_errors.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&f.all_flags.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_390);
  Adj::Adj((Adj *)&f.vert_masses.write_.shared_alloc_.direct_ptr,
           (Adj *)&vert_masses.write_.shared_alloc_.direct_ptr);
  f.verts2elems.codes.write_.shared_alloc_.direct_ptr._0_4_ = ent_dim;
  Adj::Adj((Adj *)&f.dim,(Adj *)&all_flags.write_.shared_alloc_.direct_ptr);
  f.elems2verts.codes.write_.shared_alloc_.direct_ptr._0_4_ = ncomps_00;
  Write<double>::Write((Write<double> *)&f.ncomps,(Write<double> *)local_538);
  Read<double>::Read((Read<double> *)&f.out.shared_alloc_.direct_ptr,(Read<double> *)local_430);
  n = Mesh::nverts(mesh);
  parallel_for<Omega_h::correct_momentum_error(Omega_h::Mesh*,Omega_h::TransferOpts_const&,Omega_h::Graph,Omega_h::TagBase_const*,bool)::__0>
            (n,(type *)&new_velocities.write_.shared_alloc_.direct_ptr,"correct_momentum_error");
  Write<double>::Write((Write<double> *)(local_650 + 0x10),(Write<double> *)local_538);
  Read<double>::Read((Read<double> *)(local_650 + 0x20),(Write<double> *)(local_650 + 0x10));
  Write<double>::~Write((Write<double> *)(local_650 + 0x10));
  Read<double>::Read(&local_660,(Read<double> *)(local_650 + 0x20));
  Mesh::sync_array<double>((Mesh *)local_650,ent_dim_00,(Read<double> *)0x0,(Int)&local_660);
  Read<double>::operator=((Read<double> *)(local_650 + 0x20),(Read<double> *)local_650);
  Read<double>::~Read((Read<double> *)local_650);
  Read<double>::~Read(&local_660);
  Read<double>::Read(&local_670,(Read<double> *)(local_650 + 0x20));
  Mesh::set_tag<double>(mesh,0,(string *)local_58,&local_670,false);
  Read<double>::~Read(&local_670);
  Mesh::remove_tag(mesh,ent_dim,(string *)&elem_densities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)(local_650 + 0x20));
  correct_momentum_error(Omega_h::Mesh*,Omega_h::TransferOpts_const&,Omega_h::Graph,Omega_h::TagBase_const*,bool)
  ::$_0::~__0((__0 *)&new_velocities.write_.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_538);
  Read<double>::~Read((Read<double> *)local_430);
  Read<signed_char>::~Read((Read<signed_char> *)&elem_errors.write_.shared_alloc_.direct_ptr);
  Adj::~Adj((Adj *)&all_flags.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)local_390);
  Adj::~Adj((Adj *)&vert_masses.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)local_330);
  Read<double>::~Read((Read<double> *)local_2c8);
  Read<double>::~Read((Read<double> *)local_260);
  Read<double>::~Read((Read<double> *)local_240);
  Read<double>::~Read((Read<double> *)local_1d8);
  Read<double>::~Read((Read<double> *)local_180);
  Read<double>::~Read((Read<double> *)&old_elem_densities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)local_108);
  Read<double>::~Read((Read<double> *)&elem_masses.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&elem_sizes.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)&elem_densities.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void correct_momentum_error(Mesh* mesh, TransferOpts const& xfer_opts,
    Graph diffusion_graph, TagBase const* tagbase, bool verbose) {
  auto dim = mesh->dim();
  auto ncomps = tagbase->ncomps();
  auto velocity_name = tagbase->name();
  auto momentum_name =
      xfer_opts.velocity_momentum_map.find(velocity_name)->second;
  auto density_name =
      xfer_opts.velocity_density_map.find(velocity_name)->second;
  auto error_name = momentum_name + "_error";
  auto elem_densities = mesh->get_array<Real>(dim, density_name);
  auto elem_sizes = mesh->ask_sizes();
  Reals elem_masses = multiply_each(elem_densities, elem_sizes);
  auto vert_velocities = mesh->get_array<Real>(VERT, velocity_name);
  auto old_elem_densities =
      mesh->get_array<Real>(dim, std::string("old_") + density_name);
  Reals old_elem_masses = multiply_each(old_elem_densities, elem_sizes);
  auto elem_velocities = average_field(mesh, dim, ncomps, vert_velocities);
  Reals old_elem_momenta = multiply_each(elem_velocities, old_elem_masses);
  Reals new_elem_momenta = multiply_each(elem_velocities, elem_masses);
  auto elem_errors_from_density =
      subtract_each(new_elem_momenta, old_elem_momenta);
  auto verts2elems = mesh->ask_up(VERT, dim);
  auto vert_masses = graph_reduce(verts2elems, elem_masses, 1, OMEGA_H_SUM);
  vert_masses = divide_each_by(vert_masses, Real(dim + 1));
  auto elems2verts = mesh->ask_down(dim, VERT);
  auto all_flags = get_comps_are_fixed(mesh);
  auto elem_errors = mesh->get_array<Real>(dim, error_name);
  elem_errors = add_each(elem_errors, elem_errors_from_density);
  auto diffuse_tol = xfer_opts.integral_diffuse_map.find(momentum_name)->second;
  elem_errors = diffuse_integrals_weighted(mesh, diffusion_graph, elem_errors,
      new_elem_momenta, diffuse_tol, error_name, verbose);
  mesh->set_tag(dim, error_name, elem_errors);
  auto out = deep_copy(vert_velocities);
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto v_flags = all_flags[v];
    auto v_mass = vert_masses[v];
    for (auto ve = verts2elems.a2ab[v]; ve < verts2elems.a2ab[v + 1]; ++ve) {
      auto e = verts2elems.ab2b[ve];
      auto nfree_verts = zero_vector<3>();
      for (auto ev = e * (dim + 1); ev < (e + 1) * (dim + 1); ++ev) {
        auto v2 = elems2verts.ab2b[ev];
        auto v2_flags = all_flags[v2];
        for (Int comp = 0; comp < ncomps; ++comp) {
          if (!(v2_flags & (1 << comp))) nfree_verts[comp] += 1.0;
        }
      }
      for (Int comp = 0; comp < ncomps; ++comp) {
        if (!(v_flags & (1 << comp))) {
          out[v * ncomps + comp] -=
              elem_errors[e * ncomps + comp] / (nfree_verts[comp] * v_mass);
        }
      }
    }
  };
  parallel_for(mesh->nverts(), f, "correct_momentum_error");
  auto new_velocities = Reals(out);
  new_velocities = mesh->sync_array(VERT, new_velocities, ncomps);
  mesh->set_tag(VERT, velocity_name, new_velocities);
  mesh->remove_tag(dim, error_name);
}